

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3HaltConstraint(Parse *pParse,int errCode,int onError,char *p4,i8 p4type,u8 p5Errmsg)

{
  Vdbe *p;
  Vdbe *v;
  u8 p5Errmsg_local;
  i8 p4type_local;
  char *p4_local;
  int onError_local;
  int errCode_local;
  Parse *pParse_local;
  
  p = sqlite3GetVdbe(pParse);
  if (onError == 2) {
    sqlite3MayAbort(pParse);
  }
  sqlite3VdbeAddOp4(p,0x46,errCode,onError,0,p4,(int)p4type);
  sqlite3VdbeChangeP5(p,(ushort)p5Errmsg);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3HaltConstraint(
  Parse *pParse,    /* Parsing context */
  int errCode,      /* extended error code */
  int onError,      /* Constraint type */
  char *p4,         /* Error message */
  i8 p4type,        /* P4_STATIC or P4_TRANSIENT */
  u8 p5Errmsg       /* P5_ErrMsg type */
){
  Vdbe *v;
  assert( pParse->pVdbe!=0 );
  v = sqlite3GetVdbe(pParse);
  assert( (errCode&0xff)==SQLITE_CONSTRAINT || pParse->nested );
  if( onError==OE_Abort ){
    sqlite3MayAbort(pParse);
  }
  sqlite3VdbeAddOp4(v, OP_Halt, errCode, onError, 0, p4, p4type);
  sqlite3VdbeChangeP5(v, p5Errmsg);
}